

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_char(PrintfArgFormatter<char> *this,int value)

{
  FormatSpec *pFVar1;
  CharPtr __first;
  UI_STRING *uis;
  UI *in_RSI;
  UI *ui;
  BasicWriter<char> *in_RDI;
  char fill;
  CharPtr out;
  BasicWriter<char> *w;
  FormatSpec *fmt_spec;
  int in_stack_000000ac;
  BasicWriter<char> *in_stack_000000b0;
  undefined1 in_stack_000000c0 [24];
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffbc;
  uint __n;
  
  ui = in_RSI;
  pFVar1 = ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::spec
                     ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)in_RDI);
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::writer
            ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)in_RDI,ui,uis);
  if ((pFVar1->type_ != '\0') && (pFVar1->type_ != 'c')) {
    in_stack_ffffffffffffffa8._0_4_ = pFVar1->precision_;
    in_stack_ffffffffffffffa8._4_1_ = pFVar1->type_;
    in_stack_ffffffffffffffa8._5_3_ = *(undefined3 *)&pFVar1->field_0x15;
    BasicWriter<char>::write_int<int,fmt::FormatSpec>
              (in_stack_000000b0,in_stack_000000ac,(FormatSpec)in_stack_000000c0);
  }
  if ((pFVar1->super_AlignSpec).super_WidthSpec.width_ < 2) {
    __first = BasicWriter<char>::grow_buffer(in_RDI,in_stack_ffffffffffffffa8);
  }
  else {
    __n = CONCAT13(0x20,(int3)in_stack_ffffffffffffffbc);
    __first = BasicWriter<char>::grow_buffer(in_RDI,in_stack_ffffffffffffffa8);
    if ((pFVar1->super_AlignSpec).align_ == ALIGN_LEFT) {
      std::fill_n<char*,unsigned_int,char>(__first,__n,(char *)in_RDI);
    }
    else {
      std::fill_n<char*,unsigned_int,char>(__first,__n,(char *)in_RDI);
      __first = __first + ((pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1);
    }
  }
  *__first = (char)in_RSI;
  return;
}

Assistant:

void visit_char(int value) {
    const FormatSpec &fmt_spec = this->spec();
    BasicWriter<Char> &w = this->writer();
    if (fmt_spec.type_ && fmt_spec.type_ != 'c')
      w.write_int(value, fmt_spec);
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    CharPtr out = CharPtr();
    if (fmt_spec.width_ > 1) {
      Char fill = ' ';
      out = w.grow_buffer(fmt_spec.width_);
      if (fmt_spec.align_ != ALIGN_LEFT) {
        std::fill_n(out, fmt_spec.width_ - 1, fill);
        out += fmt_spec.width_ - 1;
      } else {
        std::fill_n(out + 1, fmt_spec.width_ - 1, fill);
      }
    } else {
      out = w.grow_buffer(1);
    }
    *out = static_cast<Char>(value);
  }